

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::perceiveAuditory(HierarchicalTaskNetworkComponent *this)

{
  pointer pEVar1;
  Engram *engram;
  pointer engram_00;
  
  pEVar1 = (this->state).memory.shortTermMemory.
           super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (engram_00 = (this->state).memory.shortTermMemory.
                   super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl.
                   super__Vector_impl_data._M_start; engram_00 != pEVar1; engram_00 = engram_00 + 1)
  {
    if ((engram_00->type == Heard) && (engram_00->age < 1)) {
      addEngramToLocus(this,engram_00);
    }
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::perceiveAuditory()
{
	for(auto& engram : state.memory.shortTermMemory)
	{
		if (engram.type != EngramType::Heard)
			continue;

		if (engram.age > 0)
			continue;

		addEngramToLocus(engram);
	}
}